

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O3

void time_sleep(double seconds)

{
  int iVar1;
  timespec rem;
  timespec ts;
  timespec local_38;
  timespec local_28;
  
  if (0.0 < seconds) {
    local_28.tv_sec = (__time_t)seconds;
    local_28.tv_nsec = (long)((seconds - (double)local_28.tv_sec) * 1000000000.0);
    iVar1 = clock_nanosleep(0,0,&local_28,&local_38);
    if (iVar1 != 0) {
      do {
        local_28.tv_sec = local_38.tv_sec;
        local_28.tv_nsec = local_38.tv_nsec;
        iVar1 = clock_nanosleep(0,0,&local_28,&local_38);
      } while (iVar1 != 0);
    }
  }
  return;
}

Assistant:

void time_sleep(double seconds)
{
   struct timespec ts, rem;

   if (seconds > 0.0)
   {
      ts.tv_sec = seconds;
      ts.tv_nsec = (seconds-(double)ts.tv_sec) * 1E9;

      while (clock_nanosleep(CLOCK_REALTIME, 0, &ts, &rem))
      {
         /* copy remaining time to ts */
         ts.tv_sec  = rem.tv_sec;
         ts.tv_nsec = rem.tv_nsec;
      }
   }
}